

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O2

void zpsoe::zlog::open_log_file(FILE **file)

{
  size_t sVar1;
  FILE *pFVar2;
  ostream *poVar3;
  char *__modes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string err_;
  
  sVar1 = get_size_in_byte((string *)&DAT_0010a518);
  __modes = "wb";
  if (sVar1 < _DAT_0010a510) {
    __modes = "ab+";
  }
  pFVar2 = fopen(_DAT_0010a518,__modes);
  *file = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    return;
  }
  std::operator+(&local_48,"cannot open \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0010a518)
  ;
  std::operator+(&local_68,&local_48,"\": ");
  errno_to_str_abi_cxx11_();
  std::operator+(&err_,&local_68,&bStack_88);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&err_);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

void open_log_file(FILE **file) {
  const size_t old_log_size_ = get_size_in_byte(G_LogConfig.path);

  if (old_log_size_ >= G_LogConfig.max_byte)
    // 覆盖
    *file = fopen(G_LogConfig.path.c_str(), "wb");
  else
    // 追加
    *file = fopen(G_LogConfig.path.c_str(), "ab+");

  if (*file == NULL) {
    const string err_("cannot open \"" + G_LogConfig.path + "\": " + errno_to_str());
    cerr << err_ << endl;
    exit(EXIT_FAILURE);
  }
}